

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O0

CURLcode Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  int iVar1;
  bool bVar2;
  digestdata *local_38;
  digestdata *digest;
  Curl_easy *data;
  char *header_local;
  _Bool proxy_local;
  connectdata *conn_local;
  
  if (proxy) {
    local_38 = &(conn->data->state).proxydigest;
  }
  else {
    local_38 = &(conn->data->state).digest;
  }
  iVar1 = curl_strnequal("Digest",header,6);
  if (iVar1 == 0) {
    conn_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    data = (Curl_easy *)(header + 6);
    while( true ) {
      bVar2 = false;
      if (*(char *)&data->next != '\0') {
        iVar1 = Curl_isspace((uint)*(byte *)&data->next);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) break;
      data = (Curl_easy *)((long)&data->next + 1);
    }
    conn_local._4_4_ = Curl_auth_decode_digest_http_message((char *)data,local_38);
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_input_digest(struct connectdata *conn,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  struct Curl_easy *data = conn->data;

  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}